

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_gif_main_outofmem(stbi__gif *g,stbi_uc *out,int **delays)

{
  free(g->out);
  free(g->history);
  free(g->background);
  if (out != (stbi_uc *)0x0) {
    free(out);
  }
  if ((delays != (int **)0x0) && (*delays != (int *)0x0)) {
    free(*delays);
  }
  stbi__g_failure_reason = "outofmem";
  return "outofmem";
}

Assistant:

static void *stbi__load_gif_main_outofmem(stbi__gif *g, stbi_uc *out, int **delays)
{
   STBI_FREE(g->out);
   STBI_FREE(g->history);
   STBI_FREE(g->background);

   if (out) STBI_FREE(out);
   if (delays && *delays) STBI_FREE(*delays);
   return stbi__errpuc("outofmem", "Out of memory");
}